

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

char * fmt::v8::detail::
       parse_width<char,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v8::detail::specs_handler<char>_> *handler)

{
  int iVar1;
  char *message;
  char *begin_00;
  width_adapter local_30;
  char *local_28;
  char *begin_local;
  
  if ((byte)(*begin - 0x30U) < 10) {
    local_28 = begin;
    iVar1 = parse_nonnegative_int<char>(&local_28,end,-1);
    if (iVar1 != -1) {
      ((handler->super_specs_handler<char>).super_specs_setter<char>.specs_)->width = iVar1;
      return local_28;
    }
    message = "number is too big";
  }
  else {
    if (*begin != '{') {
      return begin;
    }
    begin_00 = begin + 1;
    if (begin_00 != end) {
      local_30.handler = handler;
      local_28 = begin_00;
      if ((*begin_00 == ':') || (*begin_00 == '}')) {
        specs_handler<char>::on_dynamic_width<fmt::v8::detail::auto_id>
                  (&handler->super_specs_handler<char>);
      }
      else {
        begin_00 = do_parse_arg_id<char,fmt::v8::detail::parse_width<char,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&>(char_const*,char_const*,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&)::width_adapter&>
                             (begin_00,end,&local_30);
      }
    }
    if ((begin_00 != end) && (*begin_00 == '}')) {
      return begin_00 + 1;
    }
    message = "invalid format string";
    local_28 = begin_00;
  }
  specs_handler<char>::on_error(&handler->super_specs_handler<char>,message);
  return local_28;
}

Assistant:

FMT_CONSTEXPR auto parse_width(const Char* begin, const Char* end,
                               Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct width_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_width(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_width(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_width(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    int width = parse_nonnegative_int(begin, end, -1);
    if (width != -1)
      handler.on_width(width);
    else
      handler.on_error("number is too big");
  } else if (*begin == '{') {
    ++begin;
    if (begin != end) begin = parse_arg_id(begin, end, width_adapter{handler});
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}